

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<llvm::StringRef>::resize(SmallVectorImpl<llvm::StringRef> *this,size_type N)

{
  undefined8 *puVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  uVar3 = (ulong)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
  if (uVar3 <= N) {
    if (N <= uVar3) {
      return;
    }
    if ((this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity < N) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,N,0x10);
      uVar3 = (ulong)(this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     Size;
    }
    if (uVar3 != N) {
      pvVar2 = (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
      lVar4 = uVar3 << 4;
      do {
        puVar1 = (undefined8 *)((long)pvVar2 + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar4 = lVar4 + 0x10;
      } while (N << 4 != lVar4);
    }
  }
  if (N <= (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<llvm::StringRef,_true>).
    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = (uint)N;
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }